

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O2

TransliteratorEntry * __thiscall
icu_63::TransliteratorRegistry::findInStaticStore
          (TransliteratorRegistry *this,TransliteratorSpec *src,TransliteratorSpec *trg,
          UnicodeString *variant)

{
  TransliteratorEntry *adopted;
  UTransDirection direction;
  TransliteratorSpec *specToFind;
  TransliteratorSpec *specToOpen;
  
  if (src->isSpecLocale == '\0') {
    if (trg->isSpecLocale == '\0') {
      return (TransliteratorEntry *)0x0;
    }
    direction = UTRANS_REVERSE;
    specToFind = src;
    specToOpen = trg;
  }
  else {
    direction = UTRANS_FORWARD;
    specToFind = trg;
    specToOpen = src;
  }
  adopted = findInBundle(specToOpen,specToFind,variant,direction);
  if (adopted == (TransliteratorEntry *)0x0) {
    return (TransliteratorEntry *)0x0;
  }
  registerEntry(this,&src->top,&trg->top,variant,adopted,'\0');
  return adopted;
}

Assistant:

TransliteratorEntry* TransliteratorRegistry::findInStaticStore(const TransliteratorSpec& src,
                                                 const TransliteratorSpec& trg,
                                                 const UnicodeString& variant) {
    TransliteratorEntry* entry = 0;
    if (src.isLocale()) {
        entry = findInBundle(src, trg, variant, UTRANS_FORWARD);
    } else if (trg.isLocale()) {
        entry = findInBundle(trg, src, variant, UTRANS_REVERSE);
    }

    // If we found an entry, store it in the Hashtable for next
    // time.
    if (entry != 0) {
        registerEntry(src.getTop(), trg.getTop(), variant, entry, FALSE);
    }

    return entry;
}